

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

MultiplyBroadcastableLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_multiplybroadcastable
          (NeuralNetworkLayer *this)

{
  ulong uVar1;
  LayerUnion LVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 900) {
    LVar2 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 900;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    LVar2.multiplybroadcastable_ =
         google::protobuf::Arena::
         CreateMaybeMessage<CoreML::Specification::MultiplyBroadcastableLayerParams>(arena);
    (this->layer_).multiplybroadcastable_ = (MultiplyBroadcastableLayerParams *)LVar2;
  }
  return (MultiplyBroadcastableLayerParams *)LVar2.convolution_;
}

Assistant:

inline ::CoreML::Specification::MultiplyBroadcastableLayerParams* NeuralNetworkLayer::_internal_mutable_multiplybroadcastable() {
  if (!_internal_has_multiplybroadcastable()) {
    clear_layer();
    set_has_multiplybroadcastable();
    layer_.multiplybroadcastable_ = CreateMaybeMessage< ::CoreML::Specification::MultiplyBroadcastableLayerParams >(GetArenaForAllocation());
  }
  return layer_.multiplybroadcastable_;
}